

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeAddTabBar(ImGuiDockNode *node)

{
  int *piVar1;
  ImGuiTabBar *this;
  
  if (node->TabBar == (ImGuiTabBar *)0x0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    this = (ImGuiTabBar *)(*GImAllocatorAllocFunc)(0x98,GImAllocatorUserData);
    ImGuiTabBar::ImGuiTabBar(this);
    node->TabBar = this;
    return;
  }
  __assert_fail("node->TabBar == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x3c75,"void ImGui::DockNodeAddTabBar(ImGuiDockNode *)");
}

Assistant:

static void ImGui::DockNodeAddTabBar(ImGuiDockNode* node)
{
    IM_ASSERT(node->TabBar == NULL);
    node->TabBar = IM_NEW(ImGuiTabBar);
}